

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testWav.cpp
# Opt level: O2

void anon_unknown.dwarf_2b5753::test(int nx,int ny)

{
  ushort uVar1;
  undefined2 uVar2;
  ostream *poVar3;
  int y_2;
  int y_1;
  ulong uVar4;
  int x;
  ulong uVar5;
  short sVar6;
  ulong uVar7;
  ulong uVar8;
  int y;
  long lVar9;
  Array2D<unsigned_short> b;
  Array2D<unsigned_short> a;
  Rand48 rand48;
  
  poVar3 = (ostream *)std::ostream::operator<<(&std::cout,nx);
  poVar3 = std::operator<<(poVar3," x ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,ny);
  std::endl<char,std::char_traits<char>>(poVar3);
  Imf_3_2::Array2D<unsigned_short>::Array2D(&a,(ulong)(uint)ny,(ulong)(uint)nx);
  Imf_3_2::Array2D<unsigned_short>::Array2D(&b,(ulong)(uint)ny,(ulong)(uint)nx);
  rand48._state[0] = 0x5a5a;
  rand48._state[1] = 0x5a5a;
  rand48._state[2] = 0x5a5a;
  lVar9 = 0;
  uVar7 = 0;
  if (0 < nx) {
    uVar7 = (ulong)(uint)nx;
  }
  uVar8 = 0;
  if (0 < ny) {
    uVar8 = (ulong)(uint)ny;
  }
  for (uVar4 = 0; uVar4 != uVar8; uVar4 = uVar4 + 1) {
    for (uVar5 = 0; uVar7 != uVar5; uVar5 = uVar5 + 1) {
      uVar1 = Imath_3_2::nrand48(rand48._state);
      *(ushort *)((long)b._data + uVar5 * 2 + b._sizeY * lVar9) = uVar1 & 0x3fff;
      *(ushort *)((long)a._data + uVar5 * 2 + a._sizeY * lVar9) = uVar1 & 0x3fff;
    }
    lVar9 = lVar9 + 2;
  }
  wavEncodeDecode(&a,&b,nx,ny);
  lVar9 = 0;
  for (uVar4 = 0; uVar4 != uVar8; uVar4 = uVar4 + 1) {
    for (uVar5 = 0; uVar7 != uVar5; uVar5 = uVar5 + 1) {
      uVar2 = Imath_3_2::nrand48(rand48._state);
      *(undefined2 *)((long)b._data + uVar5 * 2 + b._sizeY * lVar9) = uVar2;
      *(undefined2 *)((long)a._data + uVar5 * 2 + a._sizeY * lVar9) = uVar2;
    }
    lVar9 = lVar9 + 2;
  }
  wavEncodeDecode(&a,&b,nx,ny);
  fill2(&a,&b,nx,ny,0);
  wavEncodeDecode(&a,&b,nx,ny);
  fill2(&a,&b,nx,ny,1);
  wavEncodeDecode(&a,&b,nx,ny);
  fill2(&a,&b,nx,ny,0x3ffe);
  wavEncodeDecode(&a,&b,nx,ny);
  fill2(&a,&b,nx,ny,0x3fff);
  wavEncodeDecode(&a,&b,nx,ny);
  fill2(&a,&b,nx,ny,0xfffe);
  wavEncodeDecode(&a,&b,nx,ny);
  fill2(&a,&b,nx,ny,0xffff);
  wavEncodeDecode(&a,&b,nx,ny);
  lVar9 = 0;
  for (uVar4 = 0; uVar4 != uVar8; uVar4 = uVar4 + 1) {
    for (uVar5 = 0; uVar7 != uVar5; uVar5 = uVar5 + 1) {
      uVar2 = 0;
      if ((uVar5 & 1) == 0) {
        uVar2 = 0x3fff;
      }
      *(undefined2 *)((long)b._data + uVar5 * 2 + b._sizeY * lVar9) = uVar2;
      *(undefined2 *)((long)a._data + uVar5 * 2 + a._sizeY * lVar9) = uVar2;
    }
    lVar9 = lVar9 + 2;
  }
  wavEncodeDecode(&a,&b,nx,ny);
  lVar9 = 0;
  for (uVar4 = 0; uVar4 != uVar8; uVar4 = uVar4 + 1) {
    for (uVar5 = 0; uVar7 != uVar5; uVar5 = uVar5 + 1) {
      sVar6 = ((ushort)uVar5 & 1) - 1;
      *(short *)((long)b._data + uVar5 * 2 + b._sizeY * lVar9) = sVar6;
      *(short *)((long)a._data + uVar5 * 2 + a._sizeY * lVar9) = sVar6;
    }
    lVar9 = lVar9 + 2;
  }
  wavEncodeDecode(&a,&b,nx,ny);
  lVar9 = 0;
  for (uVar4 = 0; uVar4 != uVar8; uVar4 = uVar4 + 1) {
    uVar2 = 0;
    if ((uVar4 & 1) == 0) {
      uVar2 = 0x3fff;
    }
    for (uVar5 = 0; uVar7 != uVar5; uVar5 = uVar5 + 1) {
      *(undefined2 *)((long)b._data + uVar5 * 2 + b._sizeY * lVar9) = uVar2;
      *(undefined2 *)((long)a._data + uVar5 * 2 + a._sizeY * lVar9) = uVar2;
    }
    lVar9 = lVar9 + 2;
  }
  wavEncodeDecode(&a,&b,nx,ny);
  lVar9 = 0;
  for (uVar4 = 0; uVar4 != uVar8; uVar4 = uVar4 + 1) {
    sVar6 = ((ushort)uVar4 & 1) - 1;
    for (uVar5 = 0; uVar7 != uVar5; uVar5 = uVar5 + 1) {
      *(short *)((long)b._data + uVar5 * 2 + b._sizeY * lVar9) = sVar6;
      *(short *)((long)a._data + uVar5 * 2 + a._sizeY * lVar9) = sVar6;
    }
    lVar9 = lVar9 + 2;
  }
  wavEncodeDecode(&a,&b,nx,ny);
  lVar9 = 0;
  for (uVar4 = 0; uVar4 != uVar8; uVar4 = uVar4 + 1) {
    for (uVar5 = 0; uVar7 != uVar5; uVar5 = uVar5 + 1) {
      uVar2 = 0x3fff;
      if (((int)uVar4 + (int)uVar5 & 1U) != 0) {
        uVar2 = 0;
      }
      *(undefined2 *)((long)b._data + uVar5 * 2 + b._sizeY * lVar9) = uVar2;
      *(undefined2 *)((long)a._data + uVar5 * 2 + a._sizeY * lVar9) = uVar2;
    }
    lVar9 = lVar9 + 2;
  }
  wavEncodeDecode(&a,&b,nx,ny);
  lVar9 = 0;
  for (uVar4 = 0; uVar4 != uVar8; uVar4 = uVar4 + 1) {
    for (uVar5 = 0; uVar7 != uVar5; uVar5 = uVar5 + 1) {
      sVar6 = ((short)uVar4 + (short)uVar5 & 1U) - 1;
      *(short *)((long)b._data + uVar5 * 2 + b._sizeY * lVar9) = sVar6;
      *(short *)((long)a._data + uVar5 * 2 + a._sizeY * lVar9) = sVar6;
    }
    lVar9 = lVar9 + 2;
  }
  wavEncodeDecode(&a,&b,nx,ny);
  Imf_3_2::Array2D<unsigned_short>::~Array2D(&b);
  Imf_3_2::Array2D<unsigned_short>::~Array2D(&a);
  return;
}

Assistant:

void
test (int nx, int ny)
{
    cout << nx << " x " << ny << endl;

    Array2D<unsigned short> a (ny, nx);
    Array2D<unsigned short> b (ny, nx);

    IMATH_NAMESPACE::Rand48 rand48 (0);

    fill1_14bit (a, b, nx, ny, rand48);
    wavEncodeDecode (a, b, nx, ny);

    fill1_16bit (a, b, nx, ny, rand48);
    wavEncodeDecode (a, b, nx, ny);

    fill2 (a, b, nx, ny, 0);
    wavEncodeDecode (a, b, nx, ny);

    fill2 (a, b, nx, ny, 1);
    wavEncodeDecode (a, b, nx, ny);

    fill2 (a, b, nx, ny, 0x3ffe);
    wavEncodeDecode (a, b, nx, ny);

    fill2 (a, b, nx, ny, 0x3fff);
    wavEncodeDecode (a, b, nx, ny);

    fill2 (a, b, nx, ny, 0xfffe);
    wavEncodeDecode (a, b, nx, ny);

    fill2 (a, b, nx, ny, 0xffff);
    wavEncodeDecode (a, b, nx, ny);

    fill3_14bit (a, b, nx, ny);
    wavEncodeDecode (a, b, nx, ny);

    fill3_16bit (a, b, nx, ny);
    wavEncodeDecode (a, b, nx, ny);

    fill4_14bit (a, b, nx, ny);
    wavEncodeDecode (a, b, nx, ny);

    fill4_16bit (a, b, nx, ny);
    wavEncodeDecode (a, b, nx, ny);

    fill5_14bit (a, b, nx, ny);
    wavEncodeDecode (a, b, nx, ny);

    fill5_16bit (a, b, nx, ny);
    wavEncodeDecode (a, b, nx, ny);
}